

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  stbi_uc sVar5;
  int iVar6;
  stbi__uint32 sVar7;
  stbi_uc *psVar8;
  stbi__uint32 local_490;
  stbi__uint32 local_484;
  stbi__uint32 bpl;
  stbi__uint32 raw_len;
  stbi_uc *p;
  uint local_470;
  stbi__uint32 idata_limit_old;
  int filter;
  int comp;
  stbi__pngchunk c;
  stbi__context *s;
  int is_iphone;
  int color;
  int interlace;
  int k;
  int first;
  stbi__uint32 pal_len;
  stbi__uint32 i;
  stbi__uint32 idata_limit;
  stbi__uint32 ioff;
  stbi__uint16 tc16 [3];
  stbi_uc tc [3];
  stbi_uc has_trans;
  stbi_uc pal_img_n;
  stbi_uc palette [1024];
  int req_comp_local;
  int scan_local;
  stbi__png *z_local;
  
  tc16[1]._1_1_ = 0;
  tc16[1]._0_1_ = '\0';
  memset((void *)((long)&ioff + 3),0,3);
  i = 0;
  pal_len = 0;
  k = 0;
  bVar1 = true;
  is_iphone = 0;
  s._4_4_ = 0;
  bVar2 = false;
  c = (stbi__pngchunk)z->s;
  z->expanded = (stbi_uc *)0x0;
  z->idata = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar6 = stbi__check_png_header((stbi__context *)c);
  if (iVar6 == 0) {
    z_local._4_4_ = 0;
  }
  else {
    if (scan != 1) {
      do {
        _filter = stbi__get_chunk_header((stbi__context *)c);
        if (comp == 0x43674249) {
          bVar2 = true;
          stbi__skip((stbi__context *)c,filter);
        }
        else if (comp == 0x49444154) {
          if (bVar1) {
            iVar6 = stbi__err("first not IHDR");
            return iVar6;
          }
          if ((tc16[1]._1_1_ != 0) && (k == 0)) {
            iVar6 = stbi__err("no PLTE");
            return iVar6;
          }
          if (scan == 2) {
            *(uint *)((long)c + 8) = (uint)tc16[1]._1_1_;
            return 1;
          }
          if ((int)(i + filter) < (int)i) {
            return 0;
          }
          if (pal_len < i + filter) {
            p._4_4_ = pal_len;
            if (pal_len == 0) {
              if ((uint)filter < 0x1001) {
                local_490 = 0x1000;
              }
              else {
                local_490 = filter;
              }
              pal_len = local_490;
            }
            for (; pal_len < i + filter; pal_len = pal_len << 1) {
            }
            _bpl = (stbi_uc *)realloc(z->idata,(ulong)pal_len);
            if (_bpl == (stbi_uc *)0x0) {
              iVar6 = stbi__err("outofmem");
              return iVar6;
            }
            z->idata = _bpl;
          }
          iVar6 = stbi__getn((stbi__context *)c,z->idata + i,filter);
          if (iVar6 == 0) {
            iVar6 = stbi__err("outofdata");
            return iVar6;
          }
          i = filter + i;
        }
        else {
          if (comp == 0x49454e44) {
            if (bVar1) {
              iVar6 = stbi__err("first not IHDR");
              return iVar6;
            }
            if (scan != 0) {
              return 1;
            }
            if (z->idata == (stbi_uc *)0x0) {
              iVar6 = stbi__err("no IDAT");
              return iVar6;
            }
            local_484 = (*(int *)c * z->depth + 7U >> 3) * *(int *)((long)c + 4) *
                        *(int *)((long)c + 8) + *(int *)((long)c + 4);
            psVar8 = (stbi_uc *)
                     stbi_zlib_decode_malloc_guesssize_headerflag
                               ((char *)z->idata,i,local_484,(int *)&local_484,
                                (uint)((bVar2 ^ 0xffU) & 1));
            z->expanded = psVar8;
            if (z->expanded != (stbi_uc *)0x0) {
              free(z->idata);
              z->idata = (stbi_uc *)0x0;
              if ((((req_comp == *(int *)((long)c + 8) + 1) && (req_comp != 3)) &&
                  (tc16[1]._1_1_ == 0)) || ((char)tc16[1] != '\0')) {
                *(int *)((long)c + 0xc) = *(int *)((long)c + 8) + 1;
              }
              else {
                *(undefined4 *)((long)c + 0xc) = *(undefined4 *)((long)c + 8);
              }
              iVar6 = stbi__create_png_image
                                (z,z->expanded,local_484,*(int *)((long)c + 0xc),z->depth,s._4_4_,
                                 is_iphone);
              if (iVar6 == 0) {
                return 0;
              }
              if ((char)tc16[1] != '\0') {
                if (z->depth == 0x10) {
                  iVar6 = stbi__compute_transparency16
                                    (z,(stbi__uint16 *)&idata_limit,*(int *)((long)c + 0xc));
                  if (iVar6 == 0) {
                    return 0;
                  }
                }
                else {
                  iVar6 = stbi__compute_transparency
                                    (z,(stbi_uc *)((long)&ioff + 3),*(int *)((long)c + 0xc));
                  if (iVar6 == 0) {
                    return 0;
                  }
                }
              }
              if (((bVar2) && (stbi__de_iphone_flag != 0)) && (2 < *(int *)((long)c + 0xc))) {
                stbi__de_iphone(z);
              }
              if (tc16[1]._1_1_ == 0) {
                if ((char)tc16[1] != '\0') {
                  *(int *)((long)c + 8) = *(int *)((long)c + 8) + 1;
                }
              }
              else {
                *(uint *)((long)c + 8) = (uint)tc16[1]._1_1_;
                *(uint *)((long)c + 0xc) = (uint)tc16[1]._1_1_;
                if (2 < req_comp) {
                  *(int *)((long)c + 0xc) = req_comp;
                }
                iVar6 = stbi__expand_png_palette(z,(stbi_uc *)(tc16 + 2),k,*(int *)((long)c + 0xc));
                if (iVar6 == 0) {
                  return 0;
                }
              }
              free(z->expanded);
              z->expanded = (stbi_uc *)0x0;
              stbi__get32be((stbi__context *)c);
              return 1;
            }
            return 0;
          }
          if (comp == 0x49484452) {
            if (!bVar1) {
              iVar6 = stbi__err("multiple IHDR");
              return iVar6;
            }
            bVar1 = false;
            if (filter != 0xd) {
              iVar6 = stbi__err("bad IHDR len");
              return iVar6;
            }
            sVar7 = stbi__get32be((stbi__context *)c);
            *(stbi__uint32 *)c = sVar7;
            if (0x1000000 < *(uint *)c) {
              iVar6 = stbi__err("too large");
              return iVar6;
            }
            sVar7 = stbi__get32be((stbi__context *)c);
            *(stbi__uint32 *)((long)c + 4) = sVar7;
            if (0x1000000 < *(uint *)((long)c + 4)) {
              iVar6 = stbi__err("too large");
              return iVar6;
            }
            bVar3 = stbi__get8((stbi__context *)c);
            z->depth = (uint)bVar3;
            if (((z->depth != 1) && (z->depth != 2)) &&
               ((z->depth != 4 && ((z->depth != 8 && (z->depth != 0x10)))))) {
              iVar6 = stbi__err("1/2/4/8/16-bit only");
              return iVar6;
            }
            bVar3 = stbi__get8((stbi__context *)c);
            s._4_4_ = (uint)bVar3;
            if (6 < s._4_4_) {
              iVar6 = stbi__err("bad ctype");
              return iVar6;
            }
            if ((s._4_4_ == 3) && (z->depth == 0x10)) {
              iVar6 = stbi__err("bad ctype");
              return iVar6;
            }
            if (s._4_4_ == 3) {
              tc16[1]._1_1_ = 3;
            }
            else if ((bVar3 & 1) != 0) {
              iVar6 = stbi__err("bad ctype");
              return iVar6;
            }
            bVar4 = stbi__get8((stbi__context *)c);
            idata_limit_old = (stbi__uint32)bVar4;
            if (idata_limit_old != 0) {
              iVar6 = stbi__err("bad comp method");
              return iVar6;
            }
            bVar4 = stbi__get8((stbi__context *)c);
            local_470 = (uint)bVar4;
            if (local_470 != 0) {
              iVar6 = stbi__err("bad filter method");
              return iVar6;
            }
            bVar4 = stbi__get8((stbi__context *)c);
            is_iphone = (int)bVar4;
            if (1 < (uint)is_iphone) {
              iVar6 = stbi__err("bad interlace method");
              return iVar6;
            }
            if ((*(int *)c == 0) || (*(int *)((long)c + 4) == 0)) {
              iVar6 = stbi__err("0-pixel image");
              return iVar6;
            }
            if (tc16[1]._1_1_ == 0) {
              iVar6 = 1;
              if ((bVar3 & 2) != 0) {
                iVar6 = 3;
              }
              *(uint *)((long)c + 8) = iVar6 + (uint)((bVar3 & 4) != 0);
              if ((uint)((0x40000000 / (ulong)*(uint *)c) / (ulong)*(uint *)((long)c + 8)) <
                  *(uint *)((long)c + 4)) {
                iVar6 = stbi__err("too large");
                return iVar6;
              }
              if (scan == 2) {
                return 1;
              }
            }
            else {
              *(undefined4 *)((long)c + 8) = 1;
              if ((uint)(0x40000000 / (ulong)*(uint *)c >> 2) < *(uint *)((long)c + 4)) {
                iVar6 = stbi__err("too large");
                return iVar6;
              }
            }
          }
          else if (comp == 0x504c5445) {
            if (bVar1) {
              iVar6 = stbi__err("first not IHDR");
              return iVar6;
            }
            if (0x300 < (uint)filter) {
              iVar6 = stbi__err("invalid PLTE");
              return iVar6;
            }
            k = (uint)filter / 3;
            if (k * 3 != filter) {
              iVar6 = stbi__err("invalid PLTE");
              return iVar6;
            }
            for (first = 0; (uint)first < (uint)k; first = first + 1) {
              sVar5 = stbi__get8((stbi__context *)c);
              *(stbi_uc *)((long)tc16 + (ulong)(uint)(first << 2) + 4) = sVar5;
              sVar5 = stbi__get8((stbi__context *)c);
              *(stbi_uc *)((long)tc16 + (ulong)(first * 4 + 1) + 4) = sVar5;
              sVar5 = stbi__get8((stbi__context *)c);
              *(stbi_uc *)((long)tc16 + (ulong)(first * 4 + 2) + 4) = sVar5;
              *(undefined1 *)((long)tc16 + (ulong)(first * 4 + 3) + 4) = 0xff;
            }
          }
          else if (comp == 0x74524e53) {
            if (bVar1) {
              iVar6 = stbi__err("first not IHDR");
              return iVar6;
            }
            if (z->idata != (stbi_uc *)0x0) {
              iVar6 = stbi__err("tRNS after IDAT");
              return iVar6;
            }
            if (tc16[1]._1_1_ == 0) {
              if ((*(uint *)((long)c + 8) & 1) == 0) {
                iVar6 = stbi__err("tRNS with alpha");
                return iVar6;
              }
              if (filter != *(int *)((long)c + 8) * 2) {
                iVar6 = stbi__err("bad tRNS len");
                return iVar6;
              }
              tc16[1]._0_1_ = '\x01';
              if (z->depth == 0x10) {
                for (color = 0; color < *(int *)((long)c + 8); color = color + 1) {
                  iVar6 = stbi__get16be((stbi__context *)c);
                  *(short *)((long)&idata_limit + (long)color * 2) = (short)iVar6;
                }
              }
              else {
                for (color = 0; color < *(int *)((long)c + 8); color = color + 1) {
                  iVar6 = stbi__get16be((stbi__context *)c);
                  *(stbi_uc *)((long)tc16 + (long)color + -1) = (char)iVar6 * ""[z->depth];
                }
              }
            }
            else {
              if (scan == 2) {
                *(undefined4 *)((long)c + 8) = 4;
                return 1;
              }
              if (k == 0) {
                iVar6 = stbi__err("tRNS before PLTE");
                return iVar6;
              }
              if ((uint)k < (uint)filter) {
                iVar6 = stbi__err("bad tRNS len");
                return iVar6;
              }
              tc16[1]._1_1_ = 4;
              for (first = 0; (uint)first < (uint)filter; first = first + 1) {
                sVar5 = stbi__get8((stbi__context *)c);
                *(stbi_uc *)((long)tc16 + (ulong)(first * 4 + 3) + 4) = sVar5;
              }
            }
          }
          else {
            if (bVar1) {
              iVar6 = stbi__err("first not IHDR");
              return iVar6;
            }
            if (((ulong)_filter & 0x2000000000000000) == 0) {
              stbi__parse_png_file::invalid_chunk[0] = filter._7_1_;
              stbi__parse_png_file::invalid_chunk[1] = filter._6_1_;
              stbi__parse_png_file::invalid_chunk[2] = filter._5_1_;
              stbi__parse_png_file::invalid_chunk[3] = filter._4_1_;
              iVar6 = stbi__err(stbi__parse_png_file::invalid_chunk);
              return iVar6;
            }
            stbi__skip((stbi__context *)c,filter);
          }
        }
        stbi__get32be((stbi__context *)c);
      } while( true );
    }
    z_local._4_4_ = 1;
  }
  return z_local._4_4_;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}